

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonIO.hh
# Opt level: O1

void __thiscall
avro::json::JsonGenerator::encodeBinary(JsonGenerator *this,uint8_t *bytes,size_t len)

{
  uint8_t *puVar1;
  size_t sVar2;
  
  sep(this);
  if ((this->out_).next_ == (this->out_).end_) {
    StreamWriter::more(&this->out_);
  }
  puVar1 = (this->out_).next_;
  (this->out_).next_ = puVar1 + 1;
  *puVar1 = '\"';
  if (len != 0) {
    sVar2 = 0;
    do {
      escapeCtl(this,bytes[sVar2]);
      sVar2 = sVar2 + 1;
    } while (len != sVar2);
  }
  if ((this->out_).next_ == (this->out_).end_) {
    StreamWriter::more(&this->out_);
  }
  puVar1 = (this->out_).next_;
  (this->out_).next_ = puVar1 + 1;
  *puVar1 = '\"';
  if (this->top == stKey) {
    this->top = stMapN;
  }
  return;
}

Assistant:

void encodeBinary(const uint8_t* bytes, size_t len) {
        sep();
        out_.write('"');
        const uint8_t* e = bytes + len;
        while (bytes != e) {
            escapeCtl(*bytes++);
        }
        out_.write('"');
        sep2();
    }